

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int decode(jpeg *j,huffman *h)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  iVar7 = j->code_bits;
  if (iVar7 < 0x10) {
    grow_buffer_unsafe(j);
    iVar7 = j->code_bits;
  }
  uVar1 = j->code_buffer;
  cVar3 = (char)iVar7;
  uVar4 = (ulong)h->fast[uVar1 >> (cVar3 - 9U & 0x1f) & 0x1ff];
  if (uVar4 == 0xff) {
    uVar2 = uVar1 >> ((byte)(iVar7 + -0x10) & 0x1f);
    if (iVar7 < 0x10) {
      uVar2 = uVar1 << (0x10U - cVar3 & 0x1f);
    }
    lVar6 = 0;
    do {
      lVar5 = lVar6;
      lVar6 = lVar5 + 1;
    } while (h->maxcode[lVar5 + 10] <= (uVar2 & 0xffff));
    if (lVar6 == 8) {
      j->code_bits = iVar7 + -0x10;
    }
    else if ((int)lVar5 + 10 <= iVar7) {
      lVar6 = (ulong)(iVar7 - 9) - lVar6;
      iVar7 = (uVar1 >> ((byte)lVar6 & 0x1f) & bmask[lVar5 + 10]) + h->delta[lVar5 + 10];
      if ((uVar1 >> (cVar3 - h->size[iVar7] & 0x1f) & bmask[h->size[iVar7]]) == (uint)h->code[iVar7]
         ) {
        j->code_bits = (int)lVar6;
        return (uint)h->values[iVar7];
      }
      __assert_fail("(((j->code_buffer) >> (j->code_bits - h->size[c])) & bmask[h->size[c]]) == h->code[c]"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                    ,0x2e7,"int decode(jpeg *, huffman *)");
    }
  }
  else if ((int)(uint)h->size[uVar4] <= iVar7) {
    j->code_bits = iVar7 - (uint)h->size[uVar4];
    return (uint)h->values[uVar4];
  }
  return -1;
}

Assistant:

__forceinline static int decode(jpeg *j, huffman *h)
{
   unsigned int temp;
   int c,k;

   if (j->code_bits < 16) grow_buffer_unsafe(j);

   // look at the top FAST_BITS and determine what symbol ID it is,
   // if the code is <= FAST_BITS
   c = (j->code_buffer >> (j->code_bits - FAST_BITS)) & ((1 << FAST_BITS)-1);
   k = h->fast[c];
   if (k < 255) {
      if (h->size[k] > j->code_bits)
         return -1;
      j->code_bits -= h->size[k];
      return h->values[k];
   }

   // naive test is to shift the code_buffer down so k bits are
   // valid, then test against maxcode. To speed this up, we've
   // preshifted maxcode left so that it has (16-k) 0s at the
   // end; in other words, regardless of the number of bits, it
   // wants to be compared against something shifted to have 16;
   // that way we don't need to shift inside the loop.
   if (j->code_bits < 16)
      temp = (j->code_buffer << (16 - j->code_bits)) & 0xffff;
   else
      temp = (j->code_buffer >> (j->code_bits - 16)) & 0xffff;
   for (k=FAST_BITS+1 ; ; ++k)
      if (temp < h->maxcode[k])
         break;
   if (k == 17) {
      // error! code not found
      j->code_bits -= 16;
      return -1;
   }

   if (k > j->code_bits)
      return -1;

   // convert the huffman code to the symbol id
   c = ((j->code_buffer >> (j->code_bits - k)) & bmask[k]) + h->delta[k];
   assert((((j->code_buffer) >> (j->code_bits - h->size[c])) & bmask[h->size[c]]) == h->code[c]);

   // convert the id to a symbol
   j->code_bits -= k;
   return h->values[c];
}